

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::HeapClosure::HeapClosure
          (HeapClosure *this,BindingFrame *up_values,HeapObject *self,uint offset,Params *params,
          AST *body,string *builtin_name)

{
  undefined4 in_ECX;
  _func_int **in_RDX;
  HeapEntity *in_RDI;
  undefined8 in_R9;
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  *unaff_retaddr;
  string *in_stack_00000008;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_ffffffffffffffa8;
  HeapEntity *__x;
  
  __x = in_RDI;
  HeapEntity::HeapEntity(in_RDI,CLOSURE);
  in_RDI->_vptr_HeapEntity = (_func_int **)&PTR__HeapClosure_003a6590;
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
         *)in_RDI,in_stack_ffffffffffffffa8);
  in_RDI[4]._vptr_HeapEntity = in_RDX;
  in_RDI[4].mark = (char)in_ECX;
  in_RDI[4].type = (char)((uint)in_ECX >> 8);
  *(short *)&in_RDI[4].field_0xa = (short)((uint)in_ECX >> 0x10);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
  ::vector(unaff_retaddr,
           (vector<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapClosure::Param>_>
            *)__x);
  in_RDI[6].mark = (char)in_R9;
  in_RDI[6].type = (char)((ulong)in_R9 >> 8);
  *(int6 *)&in_RDI[6].field_0xa = (int6)((ulong)in_R9 >> 0x10);
  std::__cxx11::string::string((string *)(in_RDI + 7),in_stack_00000008);
  return;
}

Assistant:

HeapClosure(const BindingFrame &up_values, HeapObject *self, unsigned offset,
                const Params &params, const AST *body, const std::string &builtin_name)
        : HeapEntity(CLOSURE),
          upValues(up_values),
          self(self),
          offset(offset),
          params(params),
          body(body),
          builtinName(builtin_name)
    {
    }